

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::DeepScanLineInputFile::readPixels(DeepScanLineInputFile *this,int scanLine1,int scanLine2)

{
  element_type *peVar1;
  ArgExc *this_00;
  undefined1 in_stack_0000069f;
  int in_stack_000006a0;
  int in_stack_000006a4;
  DeepFrameBuffer *in_stack_000006a8;
  Data *in_stack_000006b0;
  char *in_stack_ffffffffffffffc8;
  
  peVar1 = std::
           __shared_ptr_access<Imf_3_3::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_3::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x136744);
  if ((peVar1->frameBufferValid & 1U) == 0) {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(this_00,in_stack_ffffffffffffffc8);
    __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  std::
  __shared_ptr_access<Imf_3_3::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_3::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1367ad);
  std::
  __shared_ptr_access<Imf_3_3::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_3::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1367bf);
  Data::readData(in_stack_000006b0,in_stack_000006a8,in_stack_000006a4,in_stack_000006a0,
                 (bool)in_stack_0000069f);
  return;
}

Assistant:

void
DeepScanLineInputFile::readPixels (int scanLine1, int scanLine2)
{
    if (!_data->frameBufferValid)
    {
        throw IEX_NAMESPACE::ArgExc (
            "readPixels called with no valid frame buffer");
    }

    _data->readData (_data->frameBuffer, scanLine1, scanLine2, false);
}